

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O2

Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t>
__thiscall kj::anon_unknown_36::NetworkAddressHttpClient::getClient(NetworkAddressHttpClient *this)

{
  _Elt_pointer pAVar1;
  _Map_pointer ppAVar2;
  AvailableClient *pAVar3;
  HttpHeaderTable *responseHeaderTable;
  bool bVar4;
  HttpClientImpl *pHVar5;
  _Elt_pointer pAVar6;
  RefcountedClient *extraout_RDX;
  RefcountedClient *extraout_RDX_00;
  RefcountedClient *pRVar7;
  NetworkAddressHttpClient *in_RSI;
  _Elt_pointer pAVar8;
  Own<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,_std::nullptr_t> OVar9;
  Own<kj::AsyncIoStream,_std::nullptr_t> stream;
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> client;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_90;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_88;
  Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> local_78;
  Own<kj::AsyncIoStream,_std::nullptr_t> local_68;
  HttpClientSettings local_58;
  
  do {
    pAVar8 = (in_RSI->availableClients).
             super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pAVar8 == (in_RSI->availableClients).
                  super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      (**((in_RSI->address).ptr)->_vptr_NetworkAddress)(&local_90);
      newPromisedStream((kj *)&local_88,
                        (Promise<kj::Own<kj::AsyncIoStream,_std::nullptr_t>_> *)&local_90);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_90);
      responseHeaderTable = in_RSI->responseHeaderTable;
      pHVar5 = (HttpClientImpl *)operator_new(0x178);
      local_68.disposer = local_88.disposer;
      local_68.ptr = local_88.ptr;
      local_88.ptr = (AsyncIoStream *)0x0;
      local_58.idleTimeout.value = (in_RSI->settings).idleTimeout.value;
      local_58.entropySource.ptr = (in_RSI->settings).entropySource.ptr;
      local_58.errorHandler.ptr = (in_RSI->settings).errorHandler.ptr;
      local_58.webSocketCompressionMode = (in_RSI->settings).webSocketCompressionMode;
      local_58.webSocketErrorHandler.ptr = (in_RSI->settings).webSocketErrorHandler.ptr;
      local_58.tlsContext.ptr = (in_RSI->settings).tlsContext.ptr;
      HttpClientImpl::HttpClientImpl(pHVar5,responseHeaderTable,&local_68,&local_58);
      local_78.disposer =
           (Disposer *)&kj::_::HeapDisposer<kj::(anonymous_namespace)::HttpClientImpl>::instance;
      local_78.ptr = pHVar5;
      Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_68);
      refcounted<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,kj::(anonymous_namespace)::NetworkAddressHttpClient&,kj::Own<kj::(anonymous_namespace)::HttpClientImpl,decltype(nullptr)>>
                ((kj *)this,in_RSI,&local_78);
      Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own(&local_78);
      Own<kj::AsyncIoStream,_std::nullptr_t>::dispose(&local_88);
      pRVar7 = extraout_RDX;
LAB_0037f55a:
      OVar9.ptr = pRVar7;
      OVar9.disposer = (Disposer *)this;
      return OVar9;
    }
    pAVar1 = (in_RSI->availableClients).
             super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_first;
    pAVar6 = pAVar8;
    if (pAVar8 == pAVar1) {
      pAVar6 = (in_RSI->availableClients).
               super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x15;
    }
    local_58.idleTimeout.value = (long)pAVar6[-1].client.disposer;
    pHVar5 = pAVar6[-1].client.ptr;
    pAVar6[-1].client.ptr = (HttpClientImpl *)0x0;
    local_58.entropySource.ptr = (EntropySource *)pHVar5;
    if (pAVar8 == pAVar1) {
      operator_delete(pAVar1,0x1f8);
      ppAVar2 = (in_RSI->availableClients).
                super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node;
      (in_RSI->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node = ppAVar2 + -1;
      pAVar3 = ppAVar2[-1];
      (in_RSI->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_first = pAVar3;
      (in_RSI->availableClients).
      super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_last = pAVar3 + 0x15;
      pAVar8 = pAVar3 + 0x14;
    }
    else {
      pAVar8 = pAVar8 + -1;
    }
    (in_RSI->availableClients).
    super__Deque_base<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient,_std::allocator<kj::(anonymous_namespace)::NetworkAddressHttpClient::AvailableClient>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pAVar8;
    Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own(&pAVar8->client);
    bVar4 = HttpClientImpl::canReuse(pHVar5);
    if (bVar4) {
      refcounted<kj::(anonymous_namespace)::NetworkAddressHttpClient::RefcountedClient,kj::(anonymous_namespace)::NetworkAddressHttpClient&,kj::Own<kj::(anonymous_namespace)::HttpClientImpl,decltype(nullptr)>>
                ((kj *)this,in_RSI,
                 (Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)&local_58);
      Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own
                ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)&local_58);
      pRVar7 = extraout_RDX_00;
      goto LAB_0037f55a;
    }
    Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::HttpClientImpl,_std::nullptr_t> *)&local_58);
  } while( true );
}

Assistant:

kj::Own<RefcountedClient> getClient() {
    for (;;) {
      if (availableClients.empty()) {
        auto stream = newPromisedStream(address->connect());
        return kj::refcounted<RefcountedClient>(*this,
          kj::heap<HttpClientImpl>(responseHeaderTable, kj::mv(stream), settings));
      } else {
        auto client = kj::mv(availableClients.back().client);
        availableClients.pop_back();
        if (client->canReuse()) {
          return kj::refcounted<RefcountedClient>(*this, kj::mv(client));
        }
        // Whoops, this client's connection was closed by the server at some point. Discard.
      }
    }
  }